

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O2

Reg ra_releasetmp(ASMState *as,IRRef ref)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  
  bVar1 = *(byte *)((long)as->ir + (ulong)ref * 8 + 6);
  iVar2 = 1 << (bVar1 & 0x1f);
  uVar3._0_4_ = as->freeset;
  uVar3._4_4_ = as->modset;
  uVar3 = CONCAT44(iVar2,iVar2) | uVar3;
  as->freeset = (int)uVar3;
  as->modset = (int)(uVar3 >> 0x20);
  *(undefined1 *)((long)as->ir + (ulong)ref * 8 + 6) = 0xff;
  return (uint)bVar1;
}

Assistant:

static Reg ra_releasetmp(ASMState *as, IRRef ref)
{
  IRIns *ir = IR(ref);
  Reg r = ir->r;
  lua_assert(ra_hasreg(r) && !ra_hasspill(ir->s));
  ra_free(as, r);
  ra_modified(as, r);
  ir->r = RID_INIT;
  return r;
}